

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
::
emplace_new_key<std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string_view<char,_std::char_traits<char>_> *key,ArgTokens *args)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
  pVar7;
  bool local_91;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
  local_90;
  iterator result;
  value_type to_insert;
  templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
  local_58 [3];
  ArgTokens *local_40;
  ArgTokens *args_local;
  basic_string_view<char,_std::char_traits<char>_> *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
  *this_local;
  bool local_10;
  
  local_40 = args;
  args_local = (ArgTokens *)key;
  key_local = (basic_string_view<char,_std::char_traits<char>_> *)current_entry;
  current_entry_local._7_1_ =
       (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
        )distance_from_desired;
  psStack_20 = this;
  if ((*(long *)(this + 0x10) != 0) &&
     ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
       )distance_from_desired != this[0x19])) {
    lVar3 = *(long *)(this + 0x20) + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = *(long *)(this + 0x10) + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)*(float *)(this + 0x1c)) {
      bVar1 = sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
              ::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
        ::
        emplace<std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                  ((sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
                    *)key_local,(int8_t)current_entry_local._7_1_,
                   (basic_string_view<char,_std::char_traits<char>_> *)args_local,local_40);
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
        ::
        templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
        ::templated_iterator(local_58,(EntryPointer)key_local);
        to_insert.second._23_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
                            *)&this_local,local_58,(bool *)&to_insert.second.field_0x17);
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>::
        pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_ArgTokens,_true>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)&result
                   ,(basic_string_view<char,_std::char_traits<char>_> *)args_local,local_40);
        std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
        std::
        swap<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)&result
                   ,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)
                    &key_local->_M_str);
        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
        ::
        templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
        ::templated_iterator(&local_90,(EntryPointer)key_local);
        current_entry_local._7_1_ =
             (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
              )((char)current_entry_local._7_1_ + '\x01');
        do {
          while( true ) {
            key_local = key_local + 3;
            bVar1 = sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
                    ::is_empty((sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>
                                *)key_local);
            if (bVar1) {
              sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
              ::
              emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
                        ((sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
                          *)key_local,(int8_t)current_entry_local._7_1_,
                         (pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)
                         &result);
              *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
              local_91 = true;
              std::
              pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
              ::
              pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>_&,_bool,_true>
                        ((pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
                          *)&this_local,&local_90,&local_91);
              pVar6._8_8_ = extraout_RDX_00;
              pVar6.first.current = (EntryPointer)this_local;
              goto LAB_0024aed8;
            }
            if ((char)current_entry_local._7_1_ <= (char)key_local->_M_len) break;
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::
            swap<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                      ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)
                       &result,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>
                                *)&key_local->_M_str);
            current_entry_local._7_1_ =
                 (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
                  )((char)current_entry_local._7_1_ + '\x01');
          }
          current_entry_local._7_1_ =
               (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
                )((char)current_entry_local._7_1_ + '\x01');
        } while (current_entry_local._7_1_ != this[0x19]);
        std::
        swap<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)&result
                   ,&((local_90.current)->field_1).value);
        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
        ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
                *)this);
        pVar6 = emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
                          (this,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>
                                 *)&result);
        local_10 = pVar6.second;
      }
      goto LAB_0024aed8;
    }
  }
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
          *)this);
  pVar6 = emplace<std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                    (this,(basic_string_view<char,_std::char_traits<char>_> *)args_local,local_40);
  local_10 = pVar6.second;
LAB_0024aed8:
  this_local = (sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }